

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFDate.cpp
# Opt level: O0

void __thiscall PDFDate::SetToCurrentTime(PDFDate *this)

{
  tm *__src;
  time_t __time1;
  long lVar1;
  long lVar2;
  double dVar3;
  time_t gmEpoch;
  time_t localEpoch;
  tm *gmTime;
  int status;
  long timeZoneSecondsDifference;
  tm structuredLocalTime;
  time_t currentTime;
  PDFDate *this_local;
  
  time((time_t *)&structuredLocalTime.tm_zone);
  __src = localtime((time_t *)&structuredLocalTime.tm_zone);
  memcpy(&timeZoneSecondsDifference,__src,0x38);
  this->Year = structuredLocalTime.tm_mday + 0x76c;
  this->Month = structuredLocalTime.tm_hour + 1;
  this->Day = structuredLocalTime.tm_min;
  this->Hour = structuredLocalTime.tm_sec;
  this->Minute = timeZoneSecondsDifference._4_4_;
  this->Second = (int)timeZoneSecondsDifference;
  gmEpoch = time((time_t *)0x0);
  localEpoch = (time_t)gmtime(&gmEpoch);
  ((tm *)localEpoch)->tm_isdst = -1;
  __time1 = mktime((tm *)localEpoch);
  dVar3 = difftime(__time1,gmEpoch);
  lVar1 = (long)dVar3;
  if (lVar1 == 0) {
    this->UTC = eSame;
  }
  else {
    this->UTC = (uint)(lVar1 < 1);
    lVar2 = lVar1;
    if (lVar1 < 1) {
      lVar2 = -lVar1;
    }
    this->HourFromUTC = (int)(lVar2 / 0xe10);
    lVar2 = lVar1;
    if (lVar1 < 1) {
      lVar2 = -lVar1;
    }
    if (lVar1 < 1) {
      lVar1 = -lVar1;
    }
    this->MinuteFromUTC = (int)((lVar2 + (lVar1 / 0xe10) * -0xe10) / 0x3c);
  }
  return;
}

Assistant:

void PDFDate::SetToCurrentTime()
{
	time_t currentTime;
	tm structuredLocalTime;
	long timeZoneSecondsDifference;

	time(&currentTime);
	SAFE_LOCAL_TIME(structuredLocalTime,currentTime);

	Year = structuredLocalTime.tm_year + 1900;
	Month = structuredLocalTime.tm_mon + 1;
	Day = structuredLocalTime.tm_mday;
	Hour = structuredLocalTime.tm_hour;
	Minute = structuredLocalTime.tm_min;
	Second = structuredLocalTime.tm_sec;

	// if unsuccesful or method unknown don't provide UTC info (currently only knows for WIN32 and OSX
#if defined (__MWERKS__) || defined (__GNUC__)  || defined(_AIX32) || defined(WIN32)
	int status;
#if !defined(__MWERKS__) // (using c methods)
	struct tm *gmTime;

	time_t localEpoch, gmEpoch;

	/*First get local epoch time*/
	localEpoch = time(NULL);

	/* Using local time epoch get the GM Time */
	gmTime = gmtime(&localEpoch);
	gmTime->tm_isdst = -1;
	/* Convert gm time in to epoch format */
	gmEpoch = mktime(gmTime);

	timeZoneSecondsDifference =difftime(gmEpoch, localEpoch);
	status = 0;
#else // __MWERKS__ (using OSX methods)
	CFTimeZoneRef tzRef = ::CFTimeZoneCopySystem();
	if (tzRef)
	{
		CFTimeInterval intervalFromGMT = ::CFTimeZoneGetSecondsFromGMT(tzRef, currentTime);
		::CFRelease(tzRef);
		timeZoneSecondsDifference = intervalFromGMT;
		status = 0;
	}
	else
		status = -1;
#endif

	if(0 == status)
	{
		if(0 == timeZoneSecondsDifference)
		{
			UTC = eSame;
		}
		else
		{
			UTC = timeZoneSecondsDifference > 0 ? eEarlier : eLater;
			HourFromUTC = (int)(labs(timeZoneSecondsDifference) / 3600);
			MinuteFromUTC = (int)((labs(timeZoneSecondsDifference) - (labs(timeZoneSecondsDifference) / 3600)*3600) / 60);
		}
	}
	else
	{
		UTC = eUndefined;
		TRACE_LOG("PDFDate::SetToCurrentTime, Couldn't get UTC.");
	}

#else
	UTC = eUndefined;
#endif
}